

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_maybe.cpp
# Opt level: O0

void __thiscall Maybe_Nothing_Test::TestBody(Maybe_Nothing_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_78;
  Message local_70 [3];
  maybe<(anonymous_namespace)::value,_void> local_58;
  maybe<(anonymous_namespace)::value,_void> local_38;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  Maybe_Nothing_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  pstore::nothing<(anonymous_namespace)::value>();
  local_58.valid_ = false;
  local_58._1_7_ = 0;
  local_58.storage_.__align = (anon_struct_8_0_00000001_for___align)0x0;
  local_58.storage_._8_8_ = 0;
  pstore::maybe<(anonymous_namespace)::value,_void>::maybe(&local_58);
  testing::internal::EqHelper::
  Compare<pstore::maybe<(anonymous_namespace)::value,_void>,_pstore::maybe<(anonymous_namespace)::value,_void>,_nullptr>
            ((EqHelper *)local_20,"pstore::nothing<value> ()","maybe<value> ()",&local_38,&local_58)
  ;
  pstore::maybe<(anonymous_namespace)::value,_void>::~maybe(&local_58);
  pstore::maybe<(anonymous_namespace)::value,_void>::~maybe(&local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_70);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_maybe.cpp"
               ,0x48,message);
    testing::internal::AssertHelper::operator=(&local_78,local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message(local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

TEST (Maybe, Nothing) {
    EXPECT_EQ (pstore::nothing<value> (), maybe<value> ());
}